

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_or.h
# Opt level: O0

void __thiscall
mp::
OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxNeg(OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict14 *disj,int param_3)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  reference pvVar4;
  LinTerms *le;
  FunctionalConstraint *in_RSI;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *in_RDI;
  NodeRange NVar5;
  int arg;
  const_iterator __end2;
  const_iterator __begin2;
  Arguments *__range2;
  array<int,_2UL> vars;
  array<double,_2UL> coefs;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe38;
  NodeIndexRange in_stack_fffffffffffffe40;
  undefined1 fSort;
  ValueNode *in_stack_fffffffffffffe70;
  AlgConRhs<_1> rr;
  AlgConRhs<_1> in_stack_fffffffffffffe90;
  array<double,_2UL> *in_stack_fffffffffffffe98;
  LinTerms *in_stack_fffffffffffffea0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  Arguments *local_38;
  undefined4 local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 local_20;
  FunctionalConstraint *local_10;
  
  local_28 = 0x3ff0000000000000;
  local_20 = 0xbff0000000000000;
  local_30 = 0xffffffff;
  local_10 = in_RSI;
  local_2c = FunctionalConstraint::GetResultVar(in_RSI);
  local_38 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
             ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                             *)(local_10 + 1));
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffe38);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffe38);
  NVar5.ir_ = in_stack_fffffffffffffe40;
  NVar5.pvn_ = in_stack_fffffffffffffe70;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       NVar5.ir_,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe38);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_40);
    iVar1 = *piVar3;
    fSort = (undefined1)((ulong)&local_30 >> 0x38);
    pvVar4 = std::array<int,_2UL>::operator[]
                       ((array<int,_2UL> *)NVar5.ir_,(size_type)in_stack_fffffffffffffe38);
    *pvVar4 = iVar1;
    le = (LinTerms *)
         BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)in_RDI);
    LinTerms::LinTerms<2ul>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (array<int,_2UL> *)in_stack_fffffffffffffe90.rhs_);
    AlgConRhs<-1>::AlgConRhs((AlgConRhs<_1> *)&stack0xfffffffffffffe90,0.0);
    rr.rhs_ = (double)NVar5.pvn_;
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (in_RDI,le,rr,(bool)fSort);
    NVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                      ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)rr.rhs_,in_RDI);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)NVar5.ir_);
    LinTerms::~LinTerms((LinTerms *)NVar5.ir_);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40);
  }
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& disj, int ) {
    std::array<double, 2> coefs{1.0, -1.0};
    std::array<int, 2> vars{-1, disj.GetResultVar()};
    for (auto arg: disj.GetArguments()) {        // res >= arg[i] in CTX-
      vars[0] = arg;
      GetMC().AddConstraint(
                     LinConLE({coefs, vars}, {0.0} ));
    }
  }